

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O3

void __thiscall EthBasePort::OnFwBusReset(EthBasePort *this,uint FwBusGeneration_FPGA)

{
  ostream *poVar1;
  
  poVar1 = (this->super_BasePort).outStr;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Firewire bus reset, FPGA = ",0x1b);
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", PC = ",7);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void EthBasePort::OnFwBusReset(unsigned int FwBusGeneration_FPGA)
{
    outStr << "Firewire bus reset, FPGA = " << std::dec << FwBusGeneration_FPGA << ", PC = " << FwBusGeneration << std::endl;
}